

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::PlotShaded<unsigned_int>
               (char *label_id,uint *xs,uint *ys,int count,double y_ref,int offset,int stride)

{
  GetterXsYs<unsigned_int> local_40;
  GetterXsYRef<unsigned_int> local_20;
  
  if (count == 0) {
    local_40.Offset = 0;
  }
  else {
    local_40.Offset = (offset % count + count) % count;
  }
  local_40.Xs = xs;
  local_40.Ys = ys;
  local_40.Count = count;
  local_40.Stride = stride;
  local_20.Xs = xs;
  local_20.YRef = y_ref;
  local_20.Count = count;
  local_20.Offset = local_40.Offset;
  local_20.Stride = stride;
  PlotShadedEx<ImPlot::GetterXsYs<unsigned_int>,ImPlot::GetterXsYRef<unsigned_int>>
            (label_id,&local_40,&local_20);
  return;
}

Assistant:

void PlotShaded(const char* label_id, const T* xs, const T* ys, int count, double y_ref, int offset, int stride) {
    GetterXsYs<T> getter1(xs, ys, count, offset, stride);
    GetterXsYRef<T> getter2(xs, y_ref, count, offset, stride);
    PlotShadedEx(label_id, getter1, getter2);
}